

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::to_pointer_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,
          bool register_expression_read)

{
  bool bVar1;
  string local_48;
  SPIRType *local_28;
  SPIRType *type;
  bool register_expression_read_local;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  type._3_1_ = register_expression_read;
  type._4_4_ = id;
  pCStack_18 = this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  local_28 = Compiler::expression_type(&this->super_Compiler,id);
  bVar1 = Compiler::is_pointer(&this->super_Compiler,local_28);
  if (((!bVar1) ||
      (bVar1 = Compiler::expression_is_lvalue(&this->super_Compiler,type._4_4_), !bVar1)) ||
     (bVar1 = should_dereference(this,type._4_4_), bVar1)) {
    to_unpacked_expression_abi_cxx11_(__return_storage_ptr__,this,type._4_4_,(bool)(type._3_1_ & 1))
    ;
  }
  else {
    to_enclosed_expression_abi_cxx11_(&local_48,this,type._4_4_,(bool)(type._3_1_ & 1));
    address_of_expression(__return_storage_ptr__,this,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_pointer_expression(uint32_t id, bool register_expression_read)
{
	auto &type = expression_type(id);
	if (is_pointer(type) && expression_is_lvalue(id) && !should_dereference(id))
		return address_of_expression(to_enclosed_expression(id, register_expression_read));
	else
		return to_unpacked_expression(id, register_expression_read);
}